

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  uint uVar7;
  _Alloc_hider _Var8;
  int iVar9;
  allocator local_71;
  string local_70;
  string local_50;
  
  if (0 < argc) {
    iVar9 = 0;
    do {
      __s1 = argv[iVar9];
      cVar1 = *__s1;
      if (cVar1 == '-') {
        if (((__s1[1] == 'x') && (__s1[2] == '\0')) ||
           (iVar3 = strcmp(__s1,"--fix-file"), iVar3 == 0)) {
LAB_00119452:
          std::__cxx11::string::string((string *)&local_70,argv[(long)iVar9 + 1],&local_71);
          Settings::addFileToFix(&local_70);
LAB_001196b7:
          _Var8._M_p = local_70._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_001196c1:
            operator_delete(_Var8._M_p);
          }
        }
        else {
          if (__s1[1] == 'b') {
            if (__s1[2] == '\0') goto LAB_001194df;
            iVar3 = strcmp(__s1,"--bundle-deps");
          }
          else {
            iVar3 = strcmp(__s1,"--bundle-deps");
          }
          if (iVar3 == 0) {
LAB_001194df:
            Settings::bundleLibs(true);
            goto LAB_001196c9;
          }
          if (((__s1[1] == 'p') && (__s1[2] == '\0')) ||
             (iVar3 = strcmp(__s1,"--install-path"), iVar3 == 0)) {
LAB_001194ee:
            std::__cxx11::string::string((string *)&local_70,argv[(long)iVar9 + 1],&local_71);
            Settings::inside_lib_path(&local_70);
            goto LAB_001196b7;
          }
LAB_001194b5:
          if (__s1[1] == 'i') {
            if ((__s1[2] != '\0') && (iVar3 = strcmp(__s1,"--ignore"), iVar3 != 0)) {
LAB_00119534:
              if ((__s1[1] != 'd') || (__s1[2] != '\0')) goto LAB_00119546;
              goto LAB_00119693;
            }
          }
          else {
            iVar3 = strcmp(__s1,"--ignore");
            if (iVar3 != 0) {
              if (cVar1 != '-') goto LAB_00119546;
              goto LAB_00119534;
            }
          }
LAB_00119663:
          std::__cxx11::string::string
                    ((string *)&local_50,argv[(long)iVar9 + 1],(allocator *)&local_70);
          Settings::ignore_prefix(&local_50);
          _Var8._M_p = local_50._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_001196c1;
        }
        iVar9 = iVar9 + 1;
      }
      else {
        iVar3 = strcmp(__s1,"--fix-file");
        if (iVar3 == 0) goto LAB_00119452;
        iVar3 = strcmp(__s1,"--bundle-deps");
        if (iVar3 == 0) goto LAB_001194df;
        iVar3 = strcmp(__s1,"--install-path");
        if (iVar3 == 0) goto LAB_001194ee;
        if (cVar1 == '-') goto LAB_001194b5;
        iVar3 = strcmp(__s1,"--ignore");
        if (iVar3 == 0) goto LAB_00119663;
LAB_00119546:
        iVar3 = strcmp(__s1,"--dest-dir");
        if (iVar3 == 0) {
LAB_00119693:
          std::__cxx11::string::string((string *)&local_70,argv[(long)iVar9 + 1],&local_71);
          Settings::destFolder(&local_70);
          goto LAB_001196b7;
        }
        iVar3 = strcmp(__s1,"-of");
        if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"--overwrite-files"), iVar3 == 0)) {
          Settings::canOverwriteFiles(true);
        }
        else {
          iVar3 = strcmp(__s1,"-od");
          if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"--overwrite-dir"), iVar3 == 0)) {
            Settings::canOverwriteDir(true);
          }
          else {
            iVar3 = strcmp(__s1,"-cd");
            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"--create-dir"), iVar3 != 0)) {
              iVar3 = strcmp(__s1,"-ns");
              if ((iVar3 == 0) || (iVar3 = strcmp(__s1,"--no-codesign"), iVar3 == 0)) {
                Settings::canCodesign(false);
                goto LAB_001196c9;
              }
              if (cVar1 == '-') {
                if (((__s1[1] == 'h') && (__s1[2] == '\0')) ||
                   (iVar3 = strcmp(__s1,"--help"), iVar3 == 0)) goto LAB_001197f8;
                if ((__s1[1] != 's') || (__s1[2] != '\0')) goto LAB_0011971c;
              }
              else {
                iVar3 = strcmp(__s1,"--help");
                if (iVar3 == 0) goto LAB_001197f8;
LAB_0011971c:
                iVar3 = strcmp(__s1,"--search-path");
                if (iVar3 != 0) {
                  if (0 < iVar9) {
                    poVar5 = std::operator<<((ostream *)&std::cerr,"Unknown flag ");
                    poVar5 = std::operator<<(poVar5,argv[iVar9]);
                    poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
                    std::endl<char,std::char_traits<char>>(poVar5);
                    showHelp();
                    exit(1);
                  }
                  goto LAB_001196c9;
                }
              }
              std::__cxx11::string::string((string *)&local_70,argv[(long)iVar9 + 1],&local_71);
              Settings::addSearchPath(&local_70);
              goto LAB_001196b7;
            }
          }
          Settings::canCreateDir(true);
        }
      }
LAB_001196c9:
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
  }
  bVar2 = Settings::bundleLibs();
  if ((bVar2) || (iVar9 = Settings::fileToFixAmount(), 0 < iVar9)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"* Collecting dependencies",0x19);
    fflush(_stdout);
    uVar4 = Settings::fileToFixAmount();
    if (0 < (int)uVar4) {
      uVar7 = 0;
      uVar6 = extraout_RDX;
      do {
        Settings::fileToFix_abi_cxx11_(&local_70,(Settings *)(ulong)uVar7,(int)uVar6);
        collectDependencies(&local_70);
        uVar6 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
          uVar6 = extraout_RDX_01;
        }
        uVar7 = uVar7 + 1;
      } while (uVar4 != uVar7);
    }
    collectSubDependencies();
    doneWithDeps_go();
    return 0;
  }
LAB_001197f8:
  showHelp();
  exit(0);
}

Assistant:

int main (int argc, char * const argv[])
{
    
    // parse arguments    
    for(int i=0; i<argc; i++)
    {
        if(strcmp(argv[i],"-x")==0 or strcmp(argv[i],"--fix-file")==0)
        {
            i++;
            Settings::addFileToFix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-b")==0 or strcmp(argv[i],"--bundle-deps")==0)
        {
            Settings::bundleLibs(true);
            continue;    
        }
        else if(strcmp(argv[i],"-p")==0 or strcmp(argv[i],"--install-path")==0)
        {
            i++;
            Settings::inside_lib_path(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-i")==0 or strcmp(argv[i],"--ignore")==0)
        {
            i++;
            Settings::ignore_prefix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-d")==0 or strcmp(argv[i],"--dest-dir")==0)
        {
            i++;
            Settings::destFolder(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-of")==0 or strcmp(argv[i],"--overwrite-files")==0)
        {
            Settings::canOverwriteFiles(true);
            continue;    
        }
        else if(strcmp(argv[i],"-od")==0 or strcmp(argv[i],"--overwrite-dir")==0)
        {
            Settings::canOverwriteDir(true);
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-cd")==0 or strcmp(argv[i],"--create-dir")==0)
        {
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-ns")==0 or strcmp(argv[i],"--no-codesign")==0)
        {
            Settings::canCodesign(false);
            continue;
        }
        else if(strcmp(argv[i],"-h")==0 or strcmp(argv[i],"--help")==0)
        {
            showHelp();
            exit(0);    
        }
        if(strcmp(argv[i],"-s")==0 or strcmp(argv[i],"--search-path")==0)
        {
            i++;
            Settings::addSearchPath(argv[i]);
            continue;
        }
        else if(i>0)
        {
            // if we meet an unknown flag, abort
            // ignore first one cause it's usually the path to the executable
            std::cerr << "Unknown flag " << argv[i] << std::endl << std::endl;
            showHelp();
            exit(1);
        }
    }
    
    if(not Settings::bundleLibs() and Settings::fileToFixAmount()<1)
    {
        showHelp();
        exit(0);
    }
    
    std::cout << "* Collecting dependencies"; fflush(stdout);
    
    const int amount = Settings::fileToFixAmount();
    for(int n=0; n<amount; n++)
        collectDependencies(Settings::fileToFix(n));
    
    collectSubDependencies();
    doneWithDeps_go();
    
    return 0;
}